

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ExecutionModel stage_to_execution_model(string *stage)

{
  bool bVar1;
  ExecutionModel EVar2;
  CompilerError *this;
  
  bVar1 = std::operator==(stage,"vert");
  EVar2 = ExecutionModelVertex;
  if (!bVar1) {
    bVar1 = std::operator==(stage,"frag");
    if (bVar1) {
      EVar2 = ExecutionModelFragment;
    }
    else {
      bVar1 = std::operator==(stage,"comp");
      if (bVar1) {
        EVar2 = ExecutionModelGLCompute;
      }
      else {
        bVar1 = std::operator==(stage,"tesc");
        if (bVar1) {
          EVar2 = ExecutionModelTessellationControl;
        }
        else {
          bVar1 = std::operator==(stage,"tese");
          if (bVar1) {
            EVar2 = ExecutionModelTessellationEvaluation;
          }
          else {
            bVar1 = std::operator==(stage,"geom");
            if (bVar1) {
              EVar2 = ExecutionModelGeometry;
            }
            else {
              bVar1 = std::operator==(stage,"rgen");
              EVar2 = ExecutionModelRayGenerationKHR;
              if (!bVar1) {
                bVar1 = std::operator==(stage,"rint");
                EVar2 = ExecutionModelIntersectionKHR;
                if (!bVar1) {
                  bVar1 = std::operator==(stage,"rahit");
                  EVar2 = ExecutionModelAnyHitKHR;
                  if (!bVar1) {
                    bVar1 = std::operator==(stage,"rchit");
                    EVar2 = ExecutionModelClosestHitKHR;
                    if (!bVar1) {
                      bVar1 = std::operator==(stage,"rmiss");
                      EVar2 = ExecutionModelMissKHR;
                      if (!bVar1) {
                        bVar1 = std::operator==(stage,"rcall");
                        EVar2 = ExecutionModelCallableKHR;
                        if (!bVar1) {
                          bVar1 = std::operator==(stage,"mesh");
                          EVar2 = ExecutionModelMeshEXT;
                          if (!bVar1) {
                            bVar1 = std::operator==(stage,"task");
                            EVar2 = ExecutionModelTaskEXT;
                            if (!bVar1) {
                              this = (CompilerError *)__cxa_allocate_exception(0x10);
                              spirv_cross::CompilerError::CompilerError(this,"Invalid stage.");
                              __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

static ExecutionModel stage_to_execution_model(const std::string &stage)
{
	if (stage == "vert")
		return ExecutionModelVertex;
	else if (stage == "frag")
		return ExecutionModelFragment;
	else if (stage == "comp")
		return ExecutionModelGLCompute;
	else if (stage == "tesc")
		return ExecutionModelTessellationControl;
	else if (stage == "tese")
		return ExecutionModelTessellationEvaluation;
	else if (stage == "geom")
		return ExecutionModelGeometry;
	else if (stage == "rgen")
		return ExecutionModelRayGenerationKHR;
	else if (stage == "rint")
		return ExecutionModelIntersectionKHR;
	else if (stage == "rahit")
		return ExecutionModelAnyHitKHR;
	else if (stage == "rchit")
		return ExecutionModelClosestHitKHR;
	else if (stage == "rmiss")
		return ExecutionModelMissKHR;
	else if (stage == "rcall")
		return ExecutionModelCallableKHR;
	else if (stage == "mesh")
		return spv::ExecutionModelMeshEXT;
	else if (stage == "task")
		return spv::ExecutionModelTaskEXT;
	else
		SPIRV_CROSS_THROW("Invalid stage.");
}